

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::AbstractTransaction::GetHash
          (ByteData256 *__return_storage_ptr__,AbstractTransaction *this,bool has_witness)

{
  ByteData buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  (*this->_vptr_AbstractTransaction[0xd])(&local_28);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
                     (ByteData *)&local_28);
  HashUtil::Sha256D(__return_storage_ptr__,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 AbstractTransaction::GetHash(bool has_witness) const {
  ByteData buffer = GetByteData(has_witness);
  // sha256d hash
  return HashUtil::Sha256D(buffer.GetBytes());
}